

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O1

bool __thiscall spvtools::opt::LoopUtils::PartiallyUnroll(LoopUtils *this,size_t factor)

{
  Loop *pLVar1;
  _Hash_node_base *p_Var2;
  DefUseManager *this_00;
  pointer pOVar3;
  PodType *pPVar4;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> _Var5;
  size_t factor_00;
  undefined8 uVar6;
  _Head_base<0UL,_spvtools::opt::Loop_*,_false> _Var7;
  bool bVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint uVar11;
  Instruction *pIVar12;
  undefined4 extraout_var;
  BasicBlock *basic_block;
  mapped_type *ppBVar13;
  int64_t iVar14;
  Instruction *pIVar15;
  ulong uVar16;
  LoopDescriptor *pLVar17;
  uint uVar18;
  ulong uVar19;
  pointer ppIVar20;
  Instruction *inst;
  ulong uVar21;
  pointer *__ptr;
  default_delete<spvtools::opt::BasicBlock> *this_01;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> _Var22;
  __node_base _Var23;
  unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_> new_loop;
  string message;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> new_exit_bb
  ;
  InstructionBuilder builder;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> new_inductions
  ;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> old_inductions
  ;
  LoopUnrollerUtilsImpl unroller;
  tuple<spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_> local_2a0;
  undefined1 local_298 [8];
  _Head_base<0UL,_spvtools::opt::Loop_*,_false> _Stack_290;
  _Head_base<0UL,_spvtools::opt::Loop_*,_false> local_288;
  _Head_base<0UL,_spvtools::opt::Loop_*,_false> *p_Stack_280;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_278;
  function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
  *local_270;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_268;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_260;
  InstructionBuilder local_258;
  Loop *local_238;
  BasicBlock *local_230;
  Instruction *local_228;
  size_t local_220;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_218;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_1f8;
  undefined1 local_1e0 [16];
  default_delete<spvtools::opt::BasicBlock> *local_1d0;
  default_delete<spvtools::opt::BasicBlock> *local_1c8;
  pointer local_1b8;
  pointer local_1b0;
  Instruction *local_158;
  BasicBlock *local_150;
  BasicBlock *local_148;
  BasicBlock *local_140;
  BasicBlock *local_138;
  __node_base_ptr *local_130;
  size_type local_128;
  __node_base local_120;
  size_type sStack_118;
  float local_110;
  size_t local_108;
  __node_base_ptr p_Stack_100;
  __node_base_ptr *local_f8;
  size_type local_f0;
  __node_base local_e8;
  size_type sStack_e0;
  float local_d8;
  size_t local_d0;
  __node_base_ptr p_Stack_c8;
  __node_base_ptr *local_c0;
  size_type local_b8;
  __node_base local_b0;
  size_type sStack_a8;
  float local_a0;
  size_t local_98;
  __node_base_ptr p_Stack_90;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_88;
  _Head_base<0UL,_spvtools::opt::Loop_*,_false> _Stack_80;
  Loop *local_78;
  BasicBlock *pBStack_70;
  Instruction *local_68;
  pointer ppIStack_60;
  pointer local_58;
  pointer ppIStack_50;
  ulong local_48;
  int64_t iStack_40;
  int64_t local_38;
  
  if ((factor == 1) || (bVar8 = CanPerformUnroll(this), !bVar8)) {
    bVar8 = false;
  }
  else {
    local_1e0._0_8_ = this->context_;
    pLVar1 = this->loop_;
    local_1e0._8_8_ = pLVar1->loop_header_->function_;
    memset(&local_1d0,0,0x98);
    local_128 = 1;
    local_120._M_nxt = (_Hash_node_base *)0x0;
    sStack_118 = 0;
    local_110 = 1.0;
    local_108 = 0;
    p_Stack_100 = (__node_base_ptr)0x0;
    local_f8 = &p_Stack_c8;
    local_f0 = 1;
    local_e8._M_nxt = (_Hash_node_base *)0x0;
    sStack_e0 = 0;
    local_d8 = 1.0;
    local_d0 = 0;
    p_Stack_c8 = (__node_base_ptr)0x0;
    local_c0 = &p_Stack_90;
    local_b8 = 1;
    local_b0._M_nxt = (_Hash_node_base *)0x0;
    sStack_a8 = 0;
    local_a0 = 1.0;
    local_98 = 0;
    p_Stack_90 = (__node_base_ptr)0x0;
    local_88._M_head_impl = (BasicBlock *)0x0;
    _Stack_80._M_head_impl = (Loop *)0x0;
    local_78 = (Loop *)0x0;
    pBStack_70 = (BasicBlock *)0x0;
    local_68 = (Instruction *)0x0;
    ppIStack_60 = (pointer)0x0;
    local_58 = (pointer)0x0;
    ppIStack_50 = (pointer)0x0;
    local_48 = 0;
    iStack_40 = 0;
    local_38 = 0;
    local_130 = &p_Stack_100;
    anon_unknown_0::LoopUnrollerUtilsImpl::Init((LoopUnrollerUtilsImpl *)local_1e0,pLVar1);
    if (factor < local_48) {
      pLVar1 = this->loop_;
      if (local_48 % factor == 0) {
        anon_unknown_0::LoopUnrollerUtilsImpl::Unroll
                  ((LoopUnrollerUtilsImpl *)local_1e0,pLVar1,factor);
        anon_unknown_0::LoopUnrollerUtilsImpl::LinkLastPhisToStart
                  ((LoopUnrollerUtilsImpl *)local_1e0,pLVar1);
        anon_unknown_0::LoopUnrollerUtilsImpl::AddBlocksToLoop
                  ((LoopUnrollerUtilsImpl *)local_1e0,pLVar1);
        anon_unknown_0::LoopUnrollerUtilsImpl::AddBlocksToFunction
                  ((LoopUnrollerUtilsImpl *)local_1e0,pLVar1->loop_merge_);
        for (; local_1b8 != local_1b0; local_1b8 = local_1b8 + 1) {
          IRContext::KillInst((IRContext *)local_1e0._0_8_,*local_1b8);
        }
      }
      else {
        local_268._M_head_impl = (BasicBlock *)pLVar1;
        pIVar12 = (Instruction *)operator_new(0x70);
        uVar6 = local_1e0._0_8_;
        uVar9 = Module::TakeNextIdBound
                          ((((unique_ptr<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                              *)(local_1e0._0_8_ + 0x30))->_M_t).
                           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
        if ((uVar9 == 0) &&
           ((((MessageConsumer *)(uVar6 + 0x38))->super__Function_base)._M_manager !=
            (_Manager_type)0x0)) {
          local_270 = (function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
                       *)(uVar6 + 0x38);
          local_298 = (undefined1  [8])&local_288;
          local_258.context_ = (IRContext *)0x25;
          local_298 = (undefined1  [8])
                      std::__cxx11::string::_M_create((ulong *)local_298,(ulong)&local_258);
          local_288._M_head_impl = (Loop *)local_258.context_;
          *(undefined8 *)local_298 = 0x667265766f204449;
          ((OperandData *)((long)local_298 + 8))->_vptr_SmallVector =
               (_func_int **)0x797254202e776f6c;
          *(undefined8 *)((long)local_298 + 0x10) = 0x676e696e6e757220;
          pPVar4 = (PodType *)((long)local_298 + 0x18);
          builtin_strncpy((pPVar4->data)._M_elems," com",4);
          pPVar4[1].data._M_elems[0] = 'p';
          pPVar4[1].data._M_elems[1] = 'a';
          pPVar4[1].data._M_elems[2] = 'c';
          pPVar4[1].data._M_elems[3] = 't';
          *(undefined8 *)((long)local_298 + 0x1d) = 0x2e7364692d746361;
          _Stack_290._M_head_impl = (Loop *)local_258.context_;
          *(char *)((long)local_258.context_ + (long)local_298) = '\0';
          local_258.context_ = (IRContext *)0x0;
          local_258.parent_ = (BasicBlock *)0x0;
          local_258.insert_before_.super_iterator.node_ = (iterator)(Instruction *)0x0;
          std::
          function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
          operator()(local_270,SPV_MSG_ERROR,"",(spv_position_t *)&local_258,(char *)local_298);
          if (local_298 != (undefined1  [8])&local_288) {
            operator_delete((void *)local_298,(ulong)((long)&(local_288._M_head_impl)->context_ + 1)
                           );
          }
        }
        local_298 = (undefined1  [8])0x0;
        _Stack_290._M_head_impl = (Loop *)0x0;
        local_288._M_head_impl = (Loop *)0x0;
        local_220 = factor;
        Instruction::Instruction
                  (pIVar12,(IRContext *)uVar6,OpLabel,0,uVar9,
                   (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   local_298);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   local_298);
        local_260._M_head_impl = (BasicBlock *)operator_new(0x88);
        (local_260._M_head_impl)->function_ = (Function *)0x0;
        ((local_260._M_head_impl)->label_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = pIVar12;
        pIVar12 = &((local_260._M_head_impl)->insts_).
                   super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
        ((local_260._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
        .super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = (Instruction *)0x0;
        ((local_260._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
        .super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = (Instruction *)0x0;
        ((local_260._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
        .super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
             (_func_int **)&PTR__Instruction_003e9ae0;
        ((local_260._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
        .unique_id_ = 0;
        ((local_260._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
        .context_ = (IRContext *)0x0;
        *(undefined8 *)
         ((long)&((local_260._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
                 sentinel_.context_ + 6) = 0;
        ((local_260._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
        .operands_.
        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        *(pointer *)
         ((long)&((local_260._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
                 sentinel_.operands_.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl + 8) = (pointer)0x0;
        *(pointer *)
         ((long)&((local_260._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
                 sentinel_.operands_.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl + 0x10) = (pointer)0x0;
        ((local_260._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
        .dbg_line_insts_.
        super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        *(pointer *)
         ((long)&((local_260._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
                 sentinel_.dbg_line_insts_.
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl + 8) = (pointer)0x0;
        *(pointer *)
         ((long)&((local_260._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
                 sentinel_.dbg_line_insts_.
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl + 0x10) = (pointer)0x0;
        local_270 = (function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
                     *)0x0;
        ((local_260._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
        .dbg_scope_.lexical_scope_ = 0;
        ((local_260._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
        .dbg_scope_.inlined_at_ = 0;
        ((local_260._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
        .super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = pIVar12;
        ((local_260._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
        .super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = pIVar12;
        ((local_260._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
        .super_IntrusiveNodeBase<spvtools::opt::Instruction>.is_sentinel_ = true;
        ((local_260._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
        _vptr_IntrusiveList = (_func_int **)&PTR__InstructionList_003e9b78;
        (local_260._M_head_impl)->function_ = (Function *)local_1e0._8_8_;
        pIVar12 = ((local_260._M_head_impl)->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        if (pIVar12->has_result_id_ == true) {
          uVar9 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
          local_270 = (function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
                       *)CONCAT44(extraout_var,uVar9);
        }
        std::
        vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
        ::
        emplace_back<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>
                  ((vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
                    *)&local_1d0,
                   (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                    *)&local_260);
        _Var5._M_head_impl = local_268._M_head_impl;
        pIVar12 = (pBStack_70->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                  super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
        if ((pIVar12 == (Instruction *)0x0) ||
           ((pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
          __assert_fail("!insts_.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h"
                        ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
        }
        local_230 = *(BasicBlock **)local_1d0;
        local_228 = (pBStack_70->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                    super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
        MakeUnique<spvtools::opt::Loop,spvtools::opt::Loop&>
                  ((spvtools *)&local_2a0,(Loop *)local_268._M_head_impl);
        std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::clear((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)((long)local_2a0.
                          super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                          .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl + 0x50))
        ;
        _Var7._M_head_impl = _Stack_80._M_head_impl;
        local_238 = (Loop *)local_2a0.
                            super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                            .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl;
        local_298 = (undefined1  [8])0x0;
        _Stack_290._M_head_impl = (Loop *)0x0;
        local_288._M_head_impl = (Loop *)0x0;
        if ((Loop *)local_88._M_head_impl != _Stack_80._M_head_impl) {
          _Var22._M_head_impl = local_88._M_head_impl;
          do {
            anon_unknown_0::LoopUnrollerUtilsImpl::CopyBasicBlock
                      ((LoopUnrollerUtilsImpl *)local_1e0,(Loop *)_Var5._M_head_impl,
                       (BasicBlock *)((Loop *)_Var22._M_head_impl)->context_,true);
            local_258.context_ = *(IRContext **)(local_1c8 + -8);
            std::vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>::
            emplace_back<spvtools::opt::BasicBlock*>
                      ((vector<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>
                        *)local_298,(BasicBlock **)&local_258);
            _Var22._M_head_impl = (BasicBlock *)&(_Var22._M_head_impl)->label_;
          } while ((Loop *)_Var22._M_head_impl != _Var7._M_head_impl);
        }
        basic_block = BasicBlock::Clone(*(BasicBlock **)((long)_Var5._M_head_impl + 0x18),
                                        (IRContext *)local_1e0._0_8_);
        basic_block->function_ = (*(BasicBlock **)((long)_Var5._M_head_impl + 0x18))->function_;
        anon_unknown_0::LoopUnrollerUtilsImpl::AssignNewResultIds
                  ((LoopUnrollerUtilsImpl *)local_1e0,basic_block);
        pIVar12 = ((*(BasicBlock **)((long)_Var5._M_head_impl + 0x18))->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar9 = 0;
        if (pIVar12->has_result_id_ == true) {
          uVar9 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
        }
        local_258.context_ = (IRContext *)CONCAT44(local_258.context_._4_4_,uVar9);
        ppBVar13 = std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&local_130,(key_type *)&local_258);
        factor_00 = local_220;
        *ppBVar13 = basic_block;
        if (local_120._M_nxt != (_Hash_node_base *)0x0) {
          _Var23._M_nxt = local_120._M_nxt;
          do {
            p_Var2 = _Var23._M_nxt[2]._M_nxt;
            for (pIVar12 = (Instruction *)p_Var2[4]._M_nxt; pIVar12 != (Instruction *)(p_Var2 + 3);
                pIVar12 = (pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_)
            {
              anon_unknown_0::LoopUnrollerUtilsImpl::RemapOperands
                        ((LoopUnrollerUtilsImpl *)local_1e0,pIVar12);
            }
            _Var23._M_nxt = (_Var23._M_nxt)->_M_nxt;
          } while (_Var23._M_nxt != (_Hash_node_base *)0x0);
        }
        pLVar1 = local_78;
        _Var5._M_head_impl = local_88._M_head_impl;
        local_88._M_head_impl = (BasicBlock *)local_298;
        _Stack_80._M_head_impl = _Stack_290._M_head_impl;
        local_78 = local_288._M_head_impl;
        local_298 = (undefined1  [8])0x0;
        _Stack_290._M_head_impl = (Loop *)0x0;
        local_288._M_head_impl = (Loop *)0x0;
        if ((Loop *)_Var5._M_head_impl != (Loop *)0x0) {
          operator_delete(_Var5._M_head_impl,(long)pLVar1 - (long)_Var5._M_head_impl);
        }
        pLVar1 = local_238;
        anon_unknown_0::LoopUnrollerUtilsImpl::AddBlocksToLoop
                  ((LoopUnrollerUtilsImpl *)local_1e0,local_238);
        pLVar1->loop_header_ = local_140;
        Loop::SetContinueBlock(pLVar1,local_150);
        Loop::SetLatchBlock(pLVar1,local_138);
        Loop::SetMergeBlock(pLVar1,basic_block);
        _Var5._M_head_impl = local_268._M_head_impl;
        if (local_298 != (undefined1  [8])0x0) {
          operator_delete((void *)local_298,(long)local_288._M_head_impl - (long)local_298);
        }
        anon_unknown_0::LoopUnrollerUtilsImpl::AddBlocksToFunction
                  ((LoopUnrollerUtilsImpl *)local_1e0,
                   *(BasicBlock **)((long)_Var5._M_head_impl + 0x18));
        this_01 = local_1d0;
        if (local_1c8 != local_1d0) {
          do {
            if (*(BasicBlock **)this_01 != (BasicBlock *)0x0) {
              std::default_delete<spvtools::opt::BasicBlock>::operator()
                        (this_01,*(BasicBlock **)this_01);
            }
            *(undefined8 *)this_01 = 0;
            this_01 = this_01 + 8;
          } while (this_01 != local_1c8);
          local_1c8 = local_1d0;
        }
        local_258.context_ = (IRContext *)local_1e0._0_8_;
        local_258.parent_ = local_230;
        local_258.insert_before_.super_iterator.node_ =
             (iterator)
             &(local_230->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
        local_258.preserved_analyses_ = kAnalysisNone;
        pIVar12 = ((*(BasicBlock **)
                     ((long)local_2a0.
                            super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                            .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl + 8))
                  ->label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar9 = 0;
        if (pIVar12->has_result_id_ == true) {
          uVar9 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
        }
        InstructionBuilder::AddBranch(&local_258,uVar9);
        pBStack_70 = local_148;
        local_68 = local_158;
        anon_unknown_0::LoopUnrollerUtilsImpl::Unroll
                  ((LoopUnrollerUtilsImpl *)local_1e0,
                   (Loop *)local_2a0.
                           super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                           .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl,
                   factor_00);
        anon_unknown_0::LoopUnrollerUtilsImpl::LinkLastPhisToStart
                  ((LoopUnrollerUtilsImpl *)local_1e0,
                   (Loop *)local_2a0.
                           super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                           .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl);
        anon_unknown_0::LoopUnrollerUtilsImpl::AddBlocksToLoop
                  ((LoopUnrollerUtilsImpl *)local_1e0,
                   (Loop *)local_2a0.
                           super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                           .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl);
        local_298 = *(undefined1 (*) [8])
                     ((long)local_2a0.
                            super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                            .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl + 0x18
                     );
        std::
        vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
        ::
        emplace_back<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>
                  ((vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
                    *)&local_1d0,
                   (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                    *)local_298);
        if (local_298 != (undefined1  [8])0x0) {
          std::default_delete<spvtools::opt::BasicBlock>::operator()
                    ((default_delete<spvtools::opt::BasicBlock> *)local_298,(BasicBlock *)local_298)
          ;
        }
        anon_unknown_0::LoopUnrollerUtilsImpl::AddBlocksToFunction
                  ((LoopUnrollerUtilsImpl *)local_1e0,
                   *(BasicBlock **)((long)_Var5._M_head_impl + 0x18));
        IRContext::InvalidateAnalysesExceptFor((IRContext *)local_1e0._0_8_,kAnalysisLoopAnalysis);
        uVar6 = local_1e0._0_8_;
        if ((*(Analysis *)(local_1e0._0_8_ + 0xe0) & kAnalysisBegin) == kAnalysisNone) {
          IRContext::BuildDefUseManager((IRContext *)local_1e0._0_8_);
        }
        this_00 = (((unique_ptr<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                     *)(uVar6 + 0x58))->_M_t).
                  super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                  .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                  _M_head_impl;
        uVar9 = Instruction::GetSingleWordOperand(local_228,0);
        pIVar12 = analysis::DefUseManager::GetDef(this_00,uVar9);
        bVar8 = Loop::IsSupportedCondition((Loop *)_Var5._M_head_impl,pIVar12->opcode_);
        if (!bVar8) {
          __assert_fail("loop->IsSupportedCondition(condition_check->opcode())",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unroller.cpp"
                        ,0x1bb,
                        "void spvtools::opt::(anonymous namespace)::LoopUnrollerUtilsImpl::PartiallyUnrollResidualFactor(Loop *, size_t)"
                       );
        }
        iVar14 = Loop::GetResidualConditionValue
                           (pIVar12->opcode_,local_38,iStack_40,local_48,factor_00);
        if (0x7ffffffe < iVar14 + 0x7fffffffU >> 1) {
          __assert_fail("remainder > std::numeric_limits<int32_t>::min() && remainder < std::numeric_limits<int32_t>::max()"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unroller.cpp"
                        ,0x1c3,
                        "void spvtools::opt::(anonymous namespace)::LoopUnrollerUtilsImpl::PartiallyUnrollResidualFactor(Loop *, size_t)"
                       );
        }
        if (iVar14 < 0) {
          pIVar15 = InstructionBuilder::GetIntConstant<int>(&local_258,(uint)iVar14,true);
        }
        else {
          pIVar15 = InstructionBuilder::GetIntConstant<unsigned_int>(&local_258,(uint)iVar14,false);
        }
        uVar9 = 0;
        if (pIVar15->has_result_id_ == true) {
          uVar9 = Instruction::GetSingleWordOperand(pIVar15,(uint)pIVar15->has_type_id_);
        }
        p_Stack_280 = &local_288;
        local_298 = (undefined1  [8])&PTR__SmallVector_003e9b28;
        local_278._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_288._M_head_impl._0_4_ = uVar9;
        _Stack_290._M_head_impl = (Loop *)0x1;
        uVar16 = (ulong)(pIVar12->has_result_id_ & 1) + 1;
        if (pIVar12->has_type_id_ == false) {
          uVar16 = (ulong)pIVar12->has_result_id_;
        }
        uVar16 = uVar16 + 1;
        pOVar3 = (pIVar12->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar19 = ((long)(pIVar12->operands_).
                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar3 >> 4) *
                 -0x5555555555555555;
        if (uVar19 < uVar16 || uVar19 - uVar16 == 0) {
LAB_00257bf6:
          p_Stack_280 = &local_288;
          local_278._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          _Stack_290._M_head_impl = (Loop *)0x1;
          local_298 = (undefined1  [8])&PTR__SmallVector_003e9b28;
          __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                        ,0x2b8,
                        "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                       );
        }
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)
                   ((long)((pOVar3->words).buffer + 0xfffffffffffffffc) +
                   (ulong)(uint)((int)uVar16 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_298);
        local_298 = (undefined1  [8])&PTR__SmallVector_003e9b28;
        if (local_278._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_278,local_278._M_head_impl);
        }
        local_218.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_218.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_218.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        Loop::GetInductionVariables
                  ((Loop *)local_2a0.
                           super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                           .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl,
                   &local_218);
        local_1f8.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1f8.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1f8.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        Loop::GetInductionVariables((Loop *)_Var5._M_head_impl,&local_1f8);
        if (local_218.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_218.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar16 = 0;
          do {
            pIVar12 = local_218.
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar16];
            pIVar15 = local_1f8.
                      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar16];
            uVar9 = anon_unknown_0::GetPhiIndexFromLabel
                              (*(BasicBlock **)
                                ((long)local_2a0.
                                       super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                                       .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>.
                                       _M_head_impl + 0x20),pIVar15);
            uVar10 = 0;
            if (pIVar15->has_result_id_ == true) {
              uVar10 = Instruction::GetSingleWordOperand(pIVar15,(uint)pIVar15->has_type_id_);
            }
            local_298 = (undefined1  [8])&PTR__SmallVector_003e9b28;
            p_Stack_280 = &local_288;
            local_278._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            local_288._M_head_impl._0_4_ = uVar10;
            _Stack_290._M_head_impl = (Loop *)0x1;
            uVar11 = (pIVar12->has_result_id_ & 1) + 1;
            if (pIVar12->has_type_id_ == false) {
              uVar11 = (uint)pIVar12->has_result_id_;
            }
            uVar18 = (uVar9 - 1) + uVar11;
            uVar19 = (ulong)uVar18;
            pOVar3 = (pIVar12->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar21 = ((long)(pIVar12->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar3 >> 4) *
                     -0x5555555555555555;
            if (uVar21 < uVar19 || uVar21 - uVar19 == 0) goto LAB_00257bf6;
            if (uVar18 < uVar11) {
LAB_00257c15:
              p_Stack_280 = &local_288;
              local_278._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
              _Stack_290._M_head_impl = (Loop *)0x1;
              local_298 = (undefined1  [8])&PTR__SmallVector_003e9b28;
              __assert_fail("index >= TypeResultIdCount() && \"operand is not a in-operand\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                            ,0x2b9,
                            "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                           );
            }
            utils::SmallVector<unsigned_int,_2UL>::operator=
                      (&pOVar3[uVar19].words,(SmallVector<unsigned_int,_2UL> *)local_298);
            local_298 = (undefined1  [8])&PTR__SmallVector_003e9b28;
            if ((_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)
                local_278._M_head_impl !=
                (_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)
                0x0) {
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&local_278,local_278._M_head_impl);
            }
            local_298 = (undefined1  [8])&PTR__SmallVector_003e9b28;
            p_Stack_280 = &local_288;
            local_278._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            local_288._M_head_impl._0_4_ = (int)local_270;
            _Stack_290._M_head_impl = (Loop *)0x1;
            uVar11 = (pIVar12->has_result_id_ & 1) + 1;
            if (pIVar12->has_type_id_ == false) {
              uVar11 = (uint)pIVar12->has_result_id_;
            }
            uVar21 = (ulong)(uVar9 + uVar11);
            pOVar3 = (pIVar12->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar19 = ((long)(pIVar12->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar3 >> 4) *
                     -0x5555555555555555;
            if (uVar19 < uVar21 || uVar19 - uVar21 == 0) goto LAB_00257bf6;
            if (uVar9 + uVar11 < uVar11) goto LAB_00257c15;
            utils::SmallVector<unsigned_int,_2UL>::operator=
                      (&pOVar3[uVar21].words,(SmallVector<unsigned_int,_2UL> *)local_298);
            local_298 = (undefined1  [8])&PTR__SmallVector_003e9b28;
            if (local_278._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0
               ) {
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&local_278,local_278._M_head_impl);
            }
            uVar9 = 0;
            if (pIVar12->has_result_id_ == true) {
              uVar9 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
            }
            uVar6 = local_1e0._0_8_;
            if ((*(Analysis *)(local_1e0._0_8_ + 0xe0) & kAnalysisBegin) == kAnalysisNone) {
              IRContext::BuildDefUseManager((IRContext *)local_1e0._0_8_);
            }
            local_298 = (undefined1  [8])local_268._M_head_impl;
            _Stack_290._M_head_impl._4_4_ = 0;
            _Stack_290._M_head_impl._0_4_ = uVar9;
            p_Stack_280 = (_Head_base<0UL,_spvtools::opt::Loop_*,_false> *)
                          std::
                          _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unroller.cpp:493:40)>
                          ::_M_invoke;
            local_288._M_head_impl =
                 (Loop *)std::
                         _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unroller.cpp:493:40)>
                         ::_M_manager;
            analysis::DefUseManager::ForEachUse
                      ((((unique_ptr<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                          *)(uVar6 + 0x58))->_M_t).
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,pIVar15,
                       (function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)local_298);
            if (local_288._M_head_impl != (Loop *)0x0) {
              (*(code *)local_288._M_head_impl)
                        ((SmallVector<unsigned_int,_2UL> *)local_298,
                         (SmallVector<unsigned_int,_2UL> *)local_298,3);
            }
            uVar16 = uVar16 + 1;
          } while (uVar16 < (ulong)((long)local_218.
                                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_218.
                                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        IRContext::InvalidateAnalysesExceptFor((IRContext *)local_1e0._0_8_,kAnalysisLoopAnalysis);
        uVar6 = local_1e0._0_8_;
        _Var5._M_head_impl = local_268._M_head_impl;
        pIVar12 = (((BasicBlock *)
                   ((local_268._M_head_impl)->insts_).
                   super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                   super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase)->
                  label_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar9 = 0;
        if (pIVar12->has_result_id_ == true) {
          uVar9 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
        }
        IRContext::ReplaceAllUsesWith((IRContext *)uVar6,uVar9,(uint32_t)local_270);
        pLVar17 = IRContext::GetLoopDescriptor
                            ((IRContext *)local_1e0._0_8_,(Function *)local_1e0._8_8_);
        local_298 = *(undefined1 (*) [8])
                     &((_Var5._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>
                      .sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.is_sentinel_;
        _Stack_290._M_head_impl =
             (Loop *)local_2a0.
                     super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                     .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl;
        local_2a0.
        super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>.
        super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>)
             (_Head_base<0UL,_spvtools::opt::Loop_*,_false>)0x0;
        std::
        vector<std::pair<spvtools::opt::Loop*,std::unique_ptr<spvtools::opt::Loop,std::default_delete<spvtools::opt::Loop>>>,std::allocator<std::pair<spvtools::opt::Loop*,std::unique_ptr<spvtools::opt::Loop,std::default_delete<spvtools::opt::Loop>>>>>
        ::
        emplace_back<std::pair<spvtools::opt::Loop*,std::unique_ptr<spvtools::opt::Loop,std::default_delete<spvtools::opt::Loop>>>>
                  ((vector<std::pair<spvtools::opt::Loop*,std::unique_ptr<spvtools::opt::Loop,std::default_delete<spvtools::opt::Loop>>>,std::allocator<std::pair<spvtools::opt::Loop*,std::unique_ptr<spvtools::opt::Loop,std::default_delete<spvtools::opt::Loop>>>>>
                    *)&pLVar17->loops_to_add_,
                   (pair<spvtools::opt::Loop_*,_std::unique_ptr<spvtools::opt::Loop,_std::default_delete<spvtools::opt::Loop>_>_>
                    *)local_298);
        ppIVar20 = local_1b8;
        if ((_Head_base<0UL,_spvtools::opt::Loop_*,_false>)_Stack_290._M_head_impl !=
            (_Head_base<0UL,_spvtools::opt::Loop_*,_false>)0x0) {
          std::default_delete<spvtools::opt::Loop>::operator()
                    ((default_delete<spvtools::opt::Loop> *)&_Stack_290,_Stack_290._M_head_impl);
          ppIVar20 = local_1b8;
        }
        for (; ppIVar20 != local_1b0; ppIVar20 = ppIVar20 + 1) {
          IRContext::KillInst((IRContext *)local_1e0._0_8_,*ppIVar20);
        }
        if (local_1f8.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1f8.
                                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.
                                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_218.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_218.
                          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_218.
                                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_218.
                                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_2a0.
            super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
            .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl !=
            (_Head_base<0UL,_spvtools::opt::Loop_*,_false>)0x0) {
          std::default_delete<spvtools::opt::Loop>::operator()
                    ((default_delete<spvtools::opt::Loop> *)&local_2a0,
                     (Loop *)local_2a0.
                             super__Tuple_impl<0UL,_spvtools::opt::Loop_*,_std::default_delete<spvtools::opt::Loop>_>
                             .super__Head_base<0UL,_spvtools::opt::Loop_*,_false>._M_head_impl);
        }
        if (local_260._M_head_impl != (BasicBlock *)0x0) {
          std::default_delete<spvtools::opt::BasicBlock>::operator()
                    ((default_delete<spvtools::opt::BasicBlock> *)&local_260,local_260._M_head_impl)
          ;
        }
      }
    }
    else {
      anon_unknown_0::LoopUnrollerUtilsImpl::FullyUnroll
                ((LoopUnrollerUtilsImpl *)local_1e0,this->loop_);
    }
    anon_unknown_0::LoopUnrollerUtilsImpl::~LoopUnrollerUtilsImpl
              ((LoopUnrollerUtilsImpl *)local_1e0);
    bVar8 = true;
  }
  return bVar8;
}

Assistant:

bool LoopUtils::PartiallyUnroll(size_t factor) {
  if (factor == 1 || !CanPerformUnroll()) return false;

  // Create the unroller utility.
  LoopUnrollerUtilsImpl unroller{context_,
                                 loop_->GetHeaderBlock()->GetParent()};
  unroller.Init(loop_);

  // If the unrolling factor is larger than or the same size as the loop just
  // fully unroll the loop.
  if (factor >= unroller.GetLoopIterationCount()) {
    unroller.FullyUnroll(loop_);
    return true;
  }

  // If the loop unrolling factor is an residual number of iterations we need to
  // let run the loop for the residual part then let it branch into the unrolled
  // remaining part. We add one when calucating the remainder to take into
  // account the one iteration already in the loop.
  if (unroller.GetLoopIterationCount() % factor != 0) {
    unroller.PartiallyUnrollResidualFactor(loop_, factor);
  } else {
    unroller.PartiallyUnroll(loop_, factor);
  }

  return true;
}